

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O3

void __thiscall Txid_TxidFromHexError_Test::TestBody(Txid_TxidFromHexError_Test *this)

{
  bool bVar1;
  Txid txid;
  AssertHelper local_58 [4];
  Txid local_38;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_58[0].data_ = (AssertHelperData *)(local_58 + 2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,
               "123456789012345678901234567890123456789012345678901234567890123412","");
    cfd::core::Txid::Txid(&local_38,(string *)local_58);
    if (local_58[0].data_ != (AssertHelperData *)(local_58 + 2)) {
      operator_delete(local_58[0].data_);
    }
    local_38._vptr_Txid = (_func_int **)&PTR__Txid_004ccb78;
    if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            (local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txid.cpp"
             ,0x2d,
             "Expected: Txid txid = Txid( \"123456789012345678901234567890123456789012345678901234567890123412\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_58,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  if (local_38._vptr_Txid != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_38._vptr_Txid != (_func_int **)0x0)) {
      (**(code **)(*local_38._vptr_Txid + 8))();
    }
  }
  return;
}

Assistant:

TEST(Txid, TxidFromHexError) {
  EXPECT_THROW(
      Txid txid = Txid( "123456789012345678901234567890123456789012345678901234567890123412"),
      CfdException);
}